

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

size_t whisper_sched_size(whisper_sched *allocr)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  size_t sVar4;
  int i;
  int iVar5;
  
  sVar4 = (long)(allocr->meta).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(allocr->meta).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  iVar5 = 0;
  while( true ) {
    iVar1 = ggml_backend_sched_get_n_backends(allocr->sched);
    if (iVar1 <= iVar5) break;
    uVar2 = ggml_backend_sched_get_backend(allocr->sched,iVar5);
    lVar3 = ggml_backend_sched_get_buffer_size(allocr->sched,uVar2);
    sVar4 = sVar4 + lVar3;
    iVar5 = iVar5 + 1;
  }
  return sVar4;
}

Assistant:

static size_t whisper_sched_size(struct whisper_sched & allocr) {
    size_t size = allocr.meta.size();
    for (int i = 0; i < ggml_backend_sched_get_n_backends(allocr.sched); ++i) {
        ggml_backend_t backend = ggml_backend_sched_get_backend(allocr.sched, i);
        size += ggml_backend_sched_get_buffer_size(allocr.sched, backend);
    }
    return size;
}